

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::requantize_from_int32_to_int8
               (Mat *src,Mat *dst,Mat *scale_in_data,Mat *scale_out_data,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  Layer *pLVar1;
  long lVar2;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined1 auStack_13c [4];
  ParamDict pd;
  Mat *local_128;
  undefined1 local_120 [8];
  undefined1 auStack_11c [8];
  undefined8 uStack_114;
  Mat weights [3];
  
  uStack_140 = 0x1490d3;
  local_128 = src;
  local_120 = (undefined1  [8])dst;
  pLVar1 = create_layer(0x3f);
  uStack_140 = 0x1490e1;
  ParamDict::ParamDict(&pd);
  uStack_140 = 0x1490ee;
  ParamDict::set(&pd,0,scale_in_data->w);
  uStack_140 = 0x1490fd;
  ParamDict::set(&pd,1,scale_out_data->w);
  uStack_140 = 0x14910d;
  ParamDict::set(&pd,2,bias_data->w);
  uStack_140 = 0x14911b;
  ParamDict::set(&pd,3,activation_type);
  uStack_140 = 0x14912e;
  ParamDict::set(&pd,4,activation_params);
  uStack_140 = 0x14913a;
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  lVar2 = 0x40;
  do {
    *(undefined8 *)((long)&weights[0].data + lVar2) = 0;
    *(undefined8 *)((long)&uStack_148 + lVar2) = 0;
    *(undefined8 *)((long)&stack0xfffffffffffffec0 + lVar2) = 0;
    *(undefined8 *)(auStack_13c + lVar2) = 0;
    *(undefined8 *)((long)&pd._vptr_ParamDict + lVar2 + 4) = 0;
    *(undefined8 *)((long)&local_128 + lVar2) = 0;
    *(undefined8 *)((long)weights + lVar2 + -0x18) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0x11c) + lVar2) = 0;
    *(undefined8 *)((long)&uStack_114 + lVar2) = 0;
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x118);
  uStack_140 = 0x14917b;
  Mat::operator=(weights,scale_in_data);
  uStack_140 = 0x149188;
  Mat::operator=(weights + 1,scale_out_data);
  uStack_140 = 0x149198;
  Mat::operator=(weights + 2,bias_data);
  uStack_140 = 0x1491a7;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0x11c) + 4),weights
            );
  uStack_140 = 0x1491b5;
  (*pLVar1->_vptr_Layer[3])(pLVar1,(undefined1 *)((long)register0x00000020 + -0x11c) + 4);
  uStack_140 = 0x1491bf;
  ModelBinFromMatArray::~ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0x11c) + 4));
  uStack_140 = 0x1491cb;
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  uStack_140 = 0x1491e1;
  (*pLVar1->_vptr_Layer[7])(pLVar1,local_128,local_120,opt);
  uStack_140 = 0x1491ed;
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  uStack_140 = 0x1491f6;
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  lVar2 = 0x90;
  do {
    uStack_140 = 0x149208;
    Mat::~Mat((Mat *)((long)&weights[0].data + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != -0x48);
  uStack_140 = 0x14921a;
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void requantize_from_int32_to_int8(const Mat& src, Mat& dst, const Mat& scale_in_data, const Mat& scale_out_data, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    Layer* requantize = create_layer(LayerType::Requantize);

    ParamDict pd;
    pd.set(0, scale_in_data.w);
    pd.set(1, scale_out_data.w);
    pd.set(2, bias_data.w);
    pd.set(3, activation_type);
    pd.set(4, activation_params);

    requantize->load_param(pd);

    Mat weights[3];
    weights[0] = scale_in_data;
    weights[1] = scale_out_data;
    weights[2] = bias_data;

    requantize->load_model(ModelBinFromMatArray(weights));

    requantize->create_pipeline(opt);

    requantize->forward(src, dst, opt);

    requantize->destroy_pipeline(opt);

    delete requantize;
}